

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugUtils.cpp
# Opt level: O0

void JsrtDebugUtils::AddScriptIdToObject(DynamicObject *object,Utf8SourceInfo *utf8SourceInfo)

{
  Utf8SourceInfo *object_00;
  uint uVar1;
  ScriptContext *pSVar2;
  JsrtDebugPropertyId local_2c;
  Utf8SourceInfo *local_28;
  Utf8SourceInfo *callerUtf8SourceInfo;
  Utf8SourceInfo *local_18;
  Utf8SourceInfo *utf8SourceInfo_local;
  DynamicObject *object_local;
  
  local_18 = utf8SourceInfo;
  utf8SourceInfo_local = (Utf8SourceInfo *)object;
  JsrtDebugPropertyId::JsrtDebugPropertyId
            ((JsrtDebugPropertyId *)((long)&callerUtf8SourceInfo + 4),scriptId);
  uVar1 = Js::Utf8SourceInfo::GetSourceInfoId(local_18);
  pSVar2 = Js::Utf8SourceInfo::GetScriptContext(local_18);
  AddPropertyToObject(object,callerUtf8SourceInfo._4_4_,uVar1,pSVar2);
  local_28 = Js::Utf8SourceInfo::GetCallerUtf8SourceInfo(local_18);
  object_00 = utf8SourceInfo_local;
  if (local_28 != (Utf8SourceInfo *)0x0) {
    JsrtDebugPropertyId::JsrtDebugPropertyId(&local_2c,parentScriptId);
    uVar1 = Js::Utf8SourceInfo::GetSourceInfoId(local_28);
    pSVar2 = Js::Utf8SourceInfo::GetScriptContext(local_28);
    AddPropertyToObject((DynamicObject *)object_00,local_2c,uVar1,pSVar2);
  }
  return;
}

Assistant:

void JsrtDebugUtils::AddScriptIdToObject(Js::DynamicObject* object, Js::Utf8SourceInfo* utf8SourceInfo)
{
    JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::scriptId, utf8SourceInfo->GetSourceInfoId(), utf8SourceInfo->GetScriptContext());

    Js::Utf8SourceInfo* callerUtf8SourceInfo = utf8SourceInfo->GetCallerUtf8SourceInfo();
    if (callerUtf8SourceInfo != nullptr)
    {
        JsrtDebugUtils::AddPropertyToObject(object, JsrtDebugPropertyId::parentScriptId, callerUtf8SourceInfo->GetSourceInfoId(), callerUtf8SourceInfo->GetScriptContext());
    }
}